

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O3

void nn_global_unlock_all_sockets(void)

{
  nn_sock *self;
  int iVar1;
  nn_ctx *self_00;
  nn_sock **ppnVar2;
  nn_list_item *it;
  long lVar3;
  long in_RDI;
  
  iVar1 = nn_is_glock_held();
  if (iVar1 != 0) {
    if ((::self.socks != (nn_sock **)0x0) && (::self.nsocks != 0)) {
      lVar3 = 0;
      ppnVar2 = ::self.socks;
      do {
        if (ppnVar2[lVar3] != (nn_sock *)0x0) {
          self_00 = nn_sock_getctx(ppnVar2[lVar3]);
          nn_ctx_leave(self_00);
          ppnVar2 = ::self.socks;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x200);
    }
    return;
  }
  nn_global_unlock_all_sockets_cold_1();
  iVar1 = nn_is_glock_held();
  if (iVar1 != 0) {
    if ((::self.socks != (nn_sock **)0x0) && (::self.nsocks != 0)) {
      lVar3 = 0;
      ppnVar2 = ::self.socks;
      do {
        if (ppnVar2[lVar3] != (nn_sock *)0x0) {
          nn_sock_stop(ppnVar2[lVar3]);
          while (self = ::self.socks[lVar3], 0 < self->holds) {
            nn_sock_rele(self);
          }
          nn_sock_term(self);
          nn_free(::self.socks[lVar3]);
          ::self.socks[lVar3] = (nn_sock *)0x0;
          ::self.nsocks = ::self.nsocks - 1;
          ppnVar2 = ::self.socks;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x200);
    }
    nn_global_term();
    return;
  }
  nn_global_postfork_cleanup_cold_1();
  if (*(code **)(in_RDI + 0x10) != (code *)0x0) {
    (**(code **)(in_RDI + 0x10))();
  }
  it = nn_list_end(&::self.transports);
  nn_list_insert(&::self.transports,(nn_list_item *)(in_RDI + 0x38),it);
  return;
}

Assistant:

void nn_global_unlock_all_sockets (void)
{
    int i;
    nn_assert(nn_is_glock_held());

    if (self.socks && self.nsocks) {
        for (i = 0; i != NN_MAX_SOCKETS; ++i)
            if (self.socks [i])
                nn_ctx_leave (nn_sock_getctx (self.socks [i]));
    }
}